

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

char * ERR_error_string(ulong e,char *buf)

{
  char *extraout_RAX;
  char *local_18;
  char *ret_local;
  uint32_t packed_error_local;
  
  local_18 = buf;
  if (buf == (char *)0x0) {
    local_18 = ERR_error_string::buf;
  }
  OPENSSL_memset(local_18,0,0x78);
  ERR_error_string_n(e & 0xffffffff,local_18,0x78);
  return extraout_RAX;
}

Assistant:

char *ERR_error_string(uint32_t packed_error, char *ret) {
  static char buf[ERR_ERROR_STRING_BUF_LEN];

  if (ret == NULL) {
    // TODO(fork): remove this.
    ret = buf;
  }

#if !defined(NDEBUG)
  // This is aimed to help catch callers who don't provide
  // |ERR_ERROR_STRING_BUF_LEN| bytes of space.
  OPENSSL_memset(ret, 0, ERR_ERROR_STRING_BUF_LEN);
#endif

  return ERR_error_string_n(packed_error, ret, ERR_ERROR_STRING_BUF_LEN);
}